

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall
dlib::tabbed_display::set_tab_name(tabbed_display *this,unsigned_long idx,ustring *new_name)

{
  value_type vVar1;
  tab_data *width;
  tab_data *last;
  reference pvVar2;
  unsigned_long *in_RDX;
  unsigned_long in_RSI;
  size_type in_RDI;
  tabbed_display *in_stack_00000020;
  unsigned_long height;
  auto_mutex M;
  rmutex *in_stack_ffffffffffffff58;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffff60;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffffb8;
  font *in_stack_ffffffffffffffc0;
  rectangle *in_stack_ffffffffffffffd8;
  base_window *in_stack_ffffffffffffffe0;
  
  auto_mutex::auto_mutex((auto_mutex *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  width = array<dlib::tabbed_display::tab_data,_dlib::memory_manager_stateless_kernel_1<char>_>::
          operator[]((array<dlib::tabbed_display::tab_data,_dlib::memory_manager_stateless_kernel_1<char>_>
                      *)(in_RDI + 0x88),in_RSI);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  operator=(in_stack_ffffffffffffff60,
            (basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
             *)in_stack_ffffffffffffff58);
  last = array<dlib::tabbed_display::tab_data,_dlib::memory_manager_stateless_kernel_1<char>_>::
         operator[]((array<dlib::tabbed_display::tab_data,_dlib::memory_manager_stateless_kernel_1<char>_>
                     *)(in_RDI + 0x88),in_RSI);
  pvVar2 = std::__cxx11::
           basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
           ::operator[](in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
  vVar1 = *pvVar2;
  array<dlib::tabbed_display::tab_data,_dlib::memory_manager_stateless_kernel_1<char>_>::operator[]
            ((array<dlib::tabbed_display::tab_data,_dlib::memory_manager_stateless_kernel_1<char>_>
              *)(in_RDI + 0x88),in_RSI);
  pvVar2 = std::__cxx11::
           basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
           ::operator[](in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
  *pvVar2 = vVar1;
  std::__shared_ptr_access<dlib::font,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<dlib::font,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x433956);
  array<dlib::tabbed_display::tab_data,_dlib::memory_manager_stateless_kernel_1<char>_>::operator[]
            ((array<dlib::tabbed_display::tab_data,_dlib::memory_manager_stateless_kernel_1<char>_>
              *)(in_RDI + 0x88),in_RSI);
  font::compute_size<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(unsigned_long *)width,in_RDX,
             in_RDI,(size_type)last);
  recompute_tabs(in_stack_00000020);
  base_window::invalidate_rectangle(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  auto_mutex::~auto_mutex((auto_mutex *)0x4339dd);
  return;
}

Assistant:

void tabbed_display::
    set_tab_name (
        unsigned long idx,
        const dlib::ustring& new_name
    )
    {
        auto_mutex M(m);


        DLIB_ASSERT ( idx < number_of_tabs() ,
                "\tvoid tabbed_display::set_tab_name()"
                << "\n\tidx:              " << idx 
                << "\n\tnumber_of_tabs(): " << number_of_tabs() );


        tabs[idx].name = new_name;
        // do this so that there isn't any reference counting going on
        tabs[idx].name[0] = tabs[idx].name[0];
        unsigned long height;
        mfont->compute_size(new_name,tabs[idx].width,height);


        recompute_tabs();

        parent.invalidate_rectangle(rect);
    }